

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O0

bool __thiscall soul::Type::isValidArrayOrVectorRange<long>(Type *this,long start,long end)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  bool local_21;
  long end_local;
  long start_local;
  Type *this_local;
  
  bVar1 = isValidArrayOrVectorIndex<long>(this,start);
  local_21 = false;
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<long>(this,end);
    if ((!bVar1) && (AVar2 = getArrayOrVectorSize(this), end != AVar2)) {
      return false;
    }
    AVar2 = convertArrayOrVectorIndexToValidRange<long>(this,start);
    AVar3 = convertArrayOrVectorIndexToValidRange<long>(this,end);
    local_21 = false;
    if (AVar2 < AVar3) {
      local_21 = end != 0;
    }
  }
  return local_21;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }